

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O3

int QGregorianCalendar::monthLength(int month,int year)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = 0;
  if (0xfffffff3 < month - 0xdU) {
    if (month != 2) {
      return (uint)month >> 3 ^ month | 0x1e;
    }
    iVar1 = 0x1c;
    uVar3 = (uint)(year < 1) + year;
    if ((uVar3 & 3) == 0) {
      uVar2 = uVar3 * -0x3d70a3d7 + 0x51eb850;
      return ((uVar2 >> 4 | uVar3 * -0x70000000) < 0xa3d70b ||
             0x28f5c28 < (uVar2 >> 2 | uVar3 * 0x40000000)) | 0x1c;
    }
  }
  return iVar1;
}

Assistant:

int QGregorianCalendar::monthLength(int month, int year)
{
    if (month < 1 || month > 12)
        return 0;

    if (month == 2)
        return leapTest(year) ? 29 : 28;

    return 30 | ((month & 1) ^ (month >> 3));
}